

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datamodel.cpp
# Opt level: O3

size_t __thiscall FSSDataModel::addDataSource(FSSDataModel *this,DataSourceType type,QString *path)

{
  DataSourceAmiga *pDVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  int iVar2;
  DataSourceAmiga *this_01;
  size_t sVar3;
  undefined1 local_71;
  QArrayData *local_70;
  char *local_68;
  AllocationOption local_60;
  DataSourceAmiga *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  char *local_48;
  PSource local_40;
  PSource local_30;
  
  if (type == DataSourceTypeCustom) {
    QString::toLocal8Bit_helper((QChar *)&local_70,(longlong)(path->d).ptr);
    if ((local_70 == (QArrayData *)0x0) ||
       (1 < (local_70->ref_)._q_value.super___atomic_base<int>._M_i)) {
      QByteArray::reallocData((longlong)&local_70,local_60);
    }
    local_48 = local_68;
    local_58 = (DataSourceAmiga *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<DataSourceCustom,std::allocator<DataSourceCustom>,char*>
              (&_Stack_50,(DataSourceCustom **)&local_58,(allocator<DataSourceCustom> *)&local_71,
               &local_48);
  }
  else if (type == DataSourceTypeAmiga) {
    QString::toLocal8Bit_helper((QChar *)&local_70,(longlong)(path->d).ptr);
    if ((local_70 == (QArrayData *)0x0) ||
       (1 < (local_70->ref_)._q_value.super___atomic_base<int>._M_i)) {
      QByteArray::reallocData((longlong)&local_70,local_60);
    }
    local_48 = local_68;
    local_58 = (DataSourceAmiga *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<DataSourceAmiga,std::allocator<DataSourceAmiga>,char*>
              (&_Stack_50,&local_58,(allocator<DataSourceAmiga> *)&local_71,&local_48);
  }
  else {
    if (type != DataSourceTypeDos) {
      return 0xffffffffffffffff;
    }
    QString::toLocal8Bit_helper((QChar *)&local_70,(longlong)(path->d).ptr);
    if ((local_70 == (QArrayData *)0x0) ||
       (1 < (local_70->ref_)._q_value.super___atomic_base<int>._M_i)) {
      QByteArray::reallocData((longlong)&local_70,local_60);
    }
    local_48 = local_68;
    local_58 = (DataSourceAmiga *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<DataSourceDOS,std::allocator<DataSourceDOS>,char*>
              (&_Stack_50,(DataSourceDOS **)&local_58,(allocator<DataSourceDOS> *)&local_71,
               &local_48);
  }
  this_00._M_pi = _Stack_50._M_pi;
  pDVar1 = local_58;
  local_58 = (DataSourceAmiga *)0x0;
  _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (local_70 != (QArrayData *)0x0) {
    LOCK();
    (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_70,1,8);
    }
  }
  sVar3 = 0xffffffffffffffff;
  if ((pDVar1 != (DataSourceAmiga *)0x0) &&
     (this_01 = pDVar1,
     iVar2 = (*(pDVar1->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source[6])()
     , (char)iVar2 != '\0')) {
    local_30.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)pDVar1;
    local_30.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         this_00._M_pi;
    if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
      }
    }
    saveSetting((FSSDataModel *)this_01,&local_30);
    if (local_30.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_30.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    local_40.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)pDVar1;
    local_40.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         this_00._M_pi;
    if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
      }
    }
    sVar3 = addDataSource(this,&local_40);
    if (local_40.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
  }
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
  }
  return sVar3;
}

Assistant:

size_t
FSSDataModel::addDataSource(DataSourceType type, const QString &path) {
  Data::PSource source;

  switch (type) {
    case DataSourceTypeDos:
      source = std::make_shared<DataSourceDOS>(path.toLocal8Bit().data());
      break;
    case DataSourceTypeAmiga:
      source = std::make_shared<DataSourceAmiga>(path.toLocal8Bit().data());
      break;
    case DataSourceTypeCustom:
      source = std::make_shared<DataSourceCustom>(path.toLocal8Bit().data());
      break;
  }

  if (source && source->load()) {
    saveSetting(source);
    return addDataSource(source);
  }

  return std::numeric_limits<size_t>::max();
}